

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkGeometryInstanceFlagsKHR
Diligent::InstanceFlagsToVkGeometryInstanceFlags(RAYTRACING_INSTANCE_FLAGS Flags)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  uint local_10;
  RAYTRACING_INSTANCE_FLAGS FlagBit;
  VkGeometryInstanceFlagsKHR Result;
  RAYTRACING_INSTANCE_FLAGS Flags_local;
  
  local_10 = 0;
  FlagBit = Flags;
  while (FlagBit != RAYTRACING_INSTANCE_NONE) {
    msg.field_2._M_local_buf[0xf] = ExtractLSB<Diligent::RAYTRACING_INSTANCE_FLAGS>(&FlagBit);
    switch(msg.field_2._M_local_buf[0xf]) {
    case '\x01':
      local_10 = local_10 | 1;
      break;
    case '\x02':
      local_10 = local_10 | 2;
      break;
    default:
      FormatString<char[22]>((string *)local_38,(char (*) [22])"unknown instance flag");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"InstanceFlagsToVkGeometryInstanceFlags",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x707);
      std::__cxx11::string::~string((string *)local_38);
      break;
    case '\x04':
      local_10 = local_10 | 4;
      break;
    case '\b':
      local_10 = local_10 | 8;
    }
  }
  return local_10;
}

Assistant:

VkGeometryInstanceFlagsKHR InstanceFlagsToVkGeometryInstanceFlags(RAYTRACING_INSTANCE_FLAGS Flags)
{
    static_assert(RAYTRACING_INSTANCE_FLAG_LAST == RAYTRACING_INSTANCE_FORCE_NO_OPAQUE,
                  "Please update the switch below to handle the new ray tracing instance flag");

    VkGeometryInstanceFlagsKHR Result = 0;
    while (Flags != RAYTRACING_INSTANCE_NONE)
    {
        RAYTRACING_INSTANCE_FLAGS FlagBit = ExtractLSB(Flags);
        switch (FlagBit)
        {
            // clang-format off
            case RAYTRACING_INSTANCE_TRIANGLE_FACING_CULL_DISABLE:    Result |= VK_GEOMETRY_INSTANCE_TRIANGLE_FACING_CULL_DISABLE_BIT_KHR;    break;
            case RAYTRACING_INSTANCE_TRIANGLE_FRONT_COUNTERCLOCKWISE: Result |= VK_GEOMETRY_INSTANCE_TRIANGLE_FRONT_COUNTERCLOCKWISE_BIT_KHR; break;
            case RAYTRACING_INSTANCE_FORCE_OPAQUE:                    Result |= VK_GEOMETRY_INSTANCE_FORCE_OPAQUE_BIT_KHR;                    break;
            case RAYTRACING_INSTANCE_FORCE_NO_OPAQUE:                 Result |= VK_GEOMETRY_INSTANCE_FORCE_NO_OPAQUE_BIT_KHR;                 break;
            // clang-format on
            default: UNEXPECTED("unknown instance flag");
        }
    }
    return Result;
}